

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

pair<const_int,_int> * __thiscall
frozen::bits::LowerBound<int,frozen::impl::CompareKey<std::less<void>>>::
doitfirst<std::pair<int_const,int>const*,32ul>
          (LowerBound<int,frozen::impl::CompareKey<std::less<void>>> *this,long first)

{
  int iVar1;
  unsigned_long next;
  pair<const_int,_int> *it;
  size_t next_start;
  size_t next_power;
  pair<const_int,_int> *first_local;
  LowerBound<int,_frozen::impl::CompareKey<std::less<void>_>_> *this_local;
  pair<const_int,_int> *local_10;
  
  iVar1 = impl::CompareKey<std::less<void>>::operator()
                    (*(void **)(this + 8),(pair<const_int,_int> *)(first + 0x78),*(int **)this);
  if (iVar1 == 0) {
    local_10 = doit_fast<std::pair<int_const,int>const*,15ul>(this,first);
  }
  else {
    local_10 = doitfirst<std::pair<int_const,int>const*,16ul>(this,first + 0x80);
  }
  return local_10;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }